

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_loadfiles(Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  CookieInfo *pCVar2;
  curl_slist *pcVar3;
  
  pcVar3 = (data->state).cookielist;
  if (pcVar3 != (curl_slist *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    do {
      pCVar2 = Curl_cookie_init(data,pcVar3->data,data->cookies,
                                SUB41((*(uint *)&(data->set).field_0x8ca & 0x10) >> 4,0));
      if (pCVar2 == (CookieInfo *)0x0) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) {
          Curl_infof(data,"ignoring failed cookie_init for %s",pcVar3->data);
        }
      }
      else {
        data->cookies = pCVar2;
      }
      pcVar3 = pcVar3->next;
    } while (pcVar3 != (curl_slist *)0x0);
    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    return;
  }
  return;
}

Assistant:

void Curl_cookie_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *list = data->state.cookielist;
  if(list) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
    while(list) {
      struct CookieInfo *ci =
        Curl_cookie_init(data, list->data, data->cookies,
                         data->set.cookiesession);
      if(!ci)
        /*
         * Failure may be due to OOM or a bad cookie; both are ignored
         * but only the first should be
         */
        infof(data, "ignoring failed cookie_init for %s", list->data);
      else
        data->cookies = ci;
      list = list->next;
    }
    Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  }
}